

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_cobs.c
# Opt level: O3

int mpt_decode_cobs_r(mpt_decode_state *dec,iovec *source,size_t sourcelen)

{
  int iVar1;
  size_t sVar2;
  mpt_message local_48;
  
  iVar1 = mpt_decode_cobs(dec,source,sourcelen);
  if (iVar1 == -0x10) {
    if (dec->_ctx == 0) {
      iVar1 = -0x10;
    }
    else {
      local_48.used = 0;
      local_48.base = (undefined1 *)0x0;
      local_48.cont = source;
      local_48.clen = sourcelen;
      mpt_message_read(&local_48,(dec->data).len + (dec->data).pos,(void *)0x0);
      if (local_48.used == 0) {
        iVar1 = -0x11;
      }
      else {
        *(char *)local_48.base = (char)dec->_ctx;
        sVar2 = (dec->data).len + 1;
        (dec->data).len = sVar2;
        (dec->data).msg = sVar2;
        dec->_ctx = 0;
        dec->curr = dec->curr + 1;
        iVar1 = 1;
      }
    }
  }
  return iVar1;
}

Assistant:

static int _decode_r
#endif
(MPT_STRUCT(decode_state) *dec, const struct iovec *source, size_t sourcelen)
{
	int ret = MPT_cobs_dec_regular(dec, source, sourcelen);
	
	/* inline zero byte */
	if (ret == MPT_ERROR(MissingData)
	    && dec->_ctx) {
		MPT_STRUCT(message) tmp;
		size_t len;
		
		len = dec->data.pos + dec->data.len;
		
		tmp.base = 0;
		tmp.used = 0;
		tmp.cont = (void *) source;
		tmp.clen = sourcelen;
		mpt_message_read(&tmp, len, 0);
		
		if (!tmp.used) {
			return MPT_ERROR(MissingBuffer);
		}
		/* add inlined end byte */
		*((uint8_t *) tmp.base) = (dec->_ctx & 0xff);
		dec->data.msg = ++dec->data.len;
		
		dec->_ctx = 0;
		++dec->curr;
		return 1;
	}
	return ret;
}